

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void duckdb_je_arena_dalloc_bin_locked_handle_newly_empty
               (tsdn_t *tsdn,arena_t *arena,edata_t *slab,bin_t *bin)

{
  size_t *psVar1;
  
  if (bin->slabcur == slab) {
    bin->slabcur = (edata_t *)0x0;
  }
  else if (duckdb_je_bin_infos[(uint)slab->e_bits >> 0x14 & 0xff].nregs == 1) {
    arena_bin_slabs_full_remove((arena_t *)(ulong)arena->ind,bin,slab);
  }
  else {
    duckdb_je_edata_heap_remove(&bin->slabs_nonfull,slab);
    psVar1 = &(bin->stats).nonfull_slabs;
    *psVar1 = *psVar1 - 1;
  }
  psVar1 = &(bin->stats).curslabs;
  *psVar1 = *psVar1 - 1;
  return;
}

Assistant:

void
arena_dalloc_bin_locked_handle_newly_empty(tsdn_t *tsdn, arena_t *arena,
    edata_t *slab, bin_t *bin) {
	arena_dissociate_bin_slab(arena, slab, bin);
	arena_dalloc_bin_slab_prepare(tsdn, slab, bin);
}